

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttp2connection.cpp
# Opt level: O0

void __thiscall QHttp2Stream::handleRST_STREAM(QHttp2Stream *this,Frame *inboundFrame)

{
  long lVar1;
  bool bVar2;
  QHttp2Stream *in_RSI;
  QHttp2Stream *in_RDI;
  long in_FS_OFFSET;
  uint *in_stack_ffffffffffffffc8;
  Http2Error errorCode;
  _Optional_payload_base<unsigned_int> local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RDI->m_state != Closed) {
    transitionState(in_RDI,(StateTransition)((ulong)in_RSI >> 0x20));
    Http2::Frame::dataBegin((Frame *)in_RSI);
    qFromBigEndian<unsigned_int>(in_RDI);
    std::optional<unsigned_int>::optional<unsigned_int,_true>
              ((optional<unsigned_int> *)in_RDI,in_stack_ffffffffffffffc8);
    (in_RDI->m_RST_STREAM_received).super__Optional_base<unsigned_int,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_int> = local_10;
    bVar2 = isUploadingDATA((QHttp2Stream *)in_RDI);
    if (bVar2) {
      QObject::disconnect((QObject *)in_RDI->m_uploadByteDevice,(char *)0x0,&in_RDI->super_QObject,
                          (char *)0x0);
      in_RDI->m_uploadDevice = (QIODevice *)0x0;
      in_RDI->m_uploadByteDevice = (QNonContiguousByteDevice *)0x0;
    }
    errorCode = (Http2Error)((ulong)in_RDI >> 0x20);
    std::optional<unsigned_int>::operator*((optional<unsigned_int> *)0x2b4e0a);
    finishWithError(in_RSI,errorCode);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QHttp2Stream::handleRST_STREAM(const Frame &inboundFrame)
{
    if (m_state == State::Closed) // The stream is already closed, we're not sending anything anyway
        return;

    transitionState(StateTransition::RST);
    m_RST_STREAM_received = qFromBigEndian<quint32>(inboundFrame.dataBegin());
    if (isUploadingDATA()) {
        disconnect(m_uploadByteDevice, nullptr, this, nullptr);
        m_uploadDevice = nullptr;
        m_uploadByteDevice = nullptr;
    }
    finishWithError(Http2Error(*m_RST_STREAM_received));
}